

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_scan.cc
# Opt level: O3

int __thiscall hwtest::pgraph::anon_unknown_2::ScanDmaTest::run(ScanDmaTest *this)

{
  chipset_info *chipset;
  Register *pRVar1;
  int iVar2;
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> *reg;
  pointer puVar3;
  vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
  local_38;
  
  chipset = &(this->super_ScanTest).super_Test.chipset;
  if ((this->super_ScanTest).super_Test.chipset.card_type < 4) {
    pgraph_dma_nv3_regs(&local_38,chipset);
    if (local_38.
        super__Vector_base<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_38.
        super__Vector_base<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      puVar3 = local_38.
               super__Vector_base<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        pRVar1 = (puVar3->_M_t).
                 super___uniq_ptr_impl<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_hwtest::pgraph::Register_*,_std::default_delete<hwtest::pgraph::Register>_>
                 .super__Head_base<0UL,_hwtest::pgraph::Register_*,_false>._M_head_impl;
        iVar2 = (*pRVar1->_vptr_Register[10])
                          (pRVar1,(ulong)(uint)(this->super_ScanTest).super_Test.cnum,
                           &(this->super_ScanTest).super_Test.rnd);
        if ((char)iVar2 != '\0') {
          (this->super_ScanTest).res = 3;
        }
        puVar3 = puVar3 + 1;
      } while (puVar3 != local_38.
                         super__Vector_base<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  else {
    pgraph_dma_nv4_regs(&local_38,chipset);
    if (local_38.
        super__Vector_base<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_38.
        super__Vector_base<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      puVar3 = local_38.
               super__Vector_base<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        pRVar1 = (puVar3->_M_t).
                 super___uniq_ptr_impl<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_hwtest::pgraph::Register_*,_std::default_delete<hwtest::pgraph::Register>_>
                 .super__Head_base<0UL,_hwtest::pgraph::Register_*,_false>._M_head_impl;
        iVar2 = (*pRVar1->_vptr_Register[10])
                          (pRVar1,(ulong)(uint)(this->super_ScanTest).super_Test.cnum,
                           &(this->super_ScanTest).super_Test.rnd);
        if ((char)iVar2 != '\0') {
          (this->super_ScanTest).res = 3;
        }
        puVar3 = puVar3 + 1;
      } while (puVar3 != local_38.
                         super__Vector_base<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  std::
  vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
  ::~vector(&local_38);
  return (this->super_ScanTest).res;
}

Assistant:

int run() override {
		if (chipset.card_type < 4) {
			for (auto &reg : pgraph_dma_nv3_regs(chipset)) {
				if (reg->scan_test(cnum, rnd))
					res = HWTEST_RES_FAIL;
			}
		} else {
			for (auto &reg : pgraph_dma_nv4_regs(chipset)) {
				if (reg->scan_test(cnum, rnd))
					res = HWTEST_RES_FAIL;
			}
		}
		return res;
	}